

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

byte * __thiscall slang::BumpAllocator::allocate(BumpAllocator *this,size_t size,size_t alignment)

{
  ulong size_00;
  size_t in_RDX;
  long in_RSI;
  long *in_RDI;
  byte *next;
  byte *base;
  BumpAllocator *local_8;
  
  local_8 = (BumpAllocator *)alignPtr(*(byte **)(*in_RDI + 8),in_RDX);
  size_00 = (long)&local_8->head + in_RSI;
  if ((ulong)in_RDI[1] < size_00) {
    local_8 = (BumpAllocator *)allocateSlow(local_8,size_00,(size_t)in_RDI);
  }
  else {
    *(ulong *)(*in_RDI + 8) = size_00;
  }
  return (byte *)local_8;
}

Assistant:

byte* allocate(size_t size, size_t alignment) {
        SLANG_ASSERT(!isFrozen());
        byte* base = alignPtr(head->current, alignment);
        byte* next = base + size;
        if (next > endPtr)
            return allocateSlow(size, alignment);

        head->current = next;
        return base;
    }